

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  cmake *this_00;
  string_view prefix;
  string_view str;
  bool bVar1;
  bool bVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined1 local_b8 [8];
  cmDocumentationEntry e;
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *g;
  iterator __end1;
  iterator __begin1;
  RegisteredGeneratorsVector *__range1;
  bool foundDefaultOne;
  string local_40 [8];
  string defaultName;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> defaultGenerator;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v_local;
  cmake *this_local;
  
  this_00 = (cmake *)((long)&defaultName.field_2 + 8);
  EvaluateDefaultGlobalGenerator(this_00);
  pcVar3 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                     ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                      this_00);
  (*pcVar3->_vptr_cmGlobalGenerator[3])(local_40);
  bVar1 = false;
  __end1 = std::
           vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ::begin(&this->Generators);
  g = (unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> *)
      std::
      vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
      ::end(&this->Generators);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_*,_std::vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>_>
                                     *)&g), bVar2) {
    e._64_8_ = __gnu_cxx::
               __normal_iterator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_*,_std::vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>_>
               ::operator*(&__end1);
    cmDocumentationEntry::cmDocumentationEntry((cmDocumentationEntry *)local_b8);
    pcVar4 = std::
             unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>::
             operator->((unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                         *)e._64_8_);
    (*pcVar4->_vptr_cmGlobalGeneratorFactory[3])(pcVar4,(cmDocumentationEntry *)local_b8);
    if (!bVar1) {
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
      prefix = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
      bVar2 = cmHasPrefix(str,prefix);
      if (bVar2) {
        e.Brief.field_2._M_local_buf[8] = '*';
        bVar1 = true;
      }
    }
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
              (v,(value_type *)local_b8);
    cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_b8);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_*,_std::vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_40);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
             ((long)&defaultName.field_2 + 8));
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const std::string defaultName = defaultGenerator->GetName();
  bool foundDefaultOne = false;

  for (const auto& g : this->Generators) {
    cmDocumentationEntry e;
    g->GetDocumentation(e);
    if (!foundDefaultOne && cmHasPrefix(e.Name, defaultName)) {
      e.CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
    v.push_back(std::move(e));
  }
}